

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

void AI::encodeEngramIfUnique
               (Stimulus stimulus,vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams)

{
  pointer *ppEVar1;
  float fVar2;
  iterator __position;
  iterator __begin2;
  Engram *pEVar3;
  iterator __end2;
  bool bVar4;
  bool bVar5;
  Engram local_38;
  
  pEVar3 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (stimulus.type == Auditory) {
    if (pEVar3 != __position._M_current) {
      bVar5 = false;
      do {
        if ((pEVar3->type == Heard) &&
           ((pEVar3->stimulus).field_3.visual.tag == stimulus.field_3.visual.tag)) {
          fVar2 = (pEVar3->stimulus).x;
          if ((fVar2 == stimulus.x) && (!NAN(fVar2) && !NAN(stimulus.x))) {
            fVar2 = (pEVar3->stimulus).y;
            if ((fVar2 == stimulus.y) && (!NAN(fVar2) && !NAN(stimulus.y))) {
              bVar5 = true;
            }
          }
        }
        pEVar3 = pEVar3 + 1;
      } while (pEVar3 != __position._M_current);
      if (bVar5) {
        return;
      }
    }
    local_38.type = Heard;
    local_38.age = 0;
  }
  else {
    if (pEVar3 != __position._M_current) {
      bVar4 = false;
      bVar5 = false;
      do {
        if ((pEVar3->type == Saw) &&
           ((pEVar3->stimulus).field_3.visual.tag == stimulus.field_3.visual.tag)) {
          fVar2 = (pEVar3->stimulus).x;
          if ((fVar2 == stimulus.x) && (!NAN(fVar2) && !NAN(stimulus.x))) {
            fVar2 = (pEVar3->stimulus).y;
            if (((fVar2 == stimulus.y) && (!NAN(fVar2) && !NAN(stimulus.y))) &&
               (bVar5 = bVar4,
               (pEVar3->stimulus).field_3.visual.target == stimulus.field_3.visual.target)) {
              bVar4 = true;
              bVar5 = true;
            }
          }
        }
        pEVar3 = pEVar3 + 1;
      } while (pEVar3 != __position._M_current);
      if (bVar5) {
        return;
      }
    }
    local_38.type = Saw;
    local_38.age = 0;
  }
  local_38.stimulus._32_8_ = stimulus._32_8_;
  local_38.stimulus._0_8_ = stimulus._0_8_;
  local_38.stimulus.field_3._0_8_ = stimulus.field_3._0_8_;
  local_38.stimulus.field_3.visual.target = stimulus.field_3.visual.target;
  local_38.stimulus.intensity = stimulus.intensity;
  local_38.stimulus._12_4_ = stimulus._12_4_;
  if (__position._M_current ==
      (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<AI::Engram,std::allocator<AI::Engram>>::_M_realloc_insert<AI::Engram_const&>
              ((vector<AI::Engram,std::allocator<AI::Engram>> *)engrams,__position,&local_38);
  }
  else {
    ((__position._M_current)->stimulus).type = local_38.stimulus.type;
    *(int *)&((__position._M_current)->stimulus).field_0x24 = local_38.stimulus._36_4_;
    (__position._M_current)->type = local_38.type;
    (__position._M_current)->age = local_38.age;
    *(undefined8 *)&((__position._M_current)->stimulus).field_3 = local_38.stimulus.field_3._0_8_;
    ((__position._M_current)->stimulus).field_3.visual.target = stimulus.field_3.visual.target;
    ((__position._M_current)->stimulus).x = local_38.stimulus.x;
    ((__position._M_current)->stimulus).y = local_38.stimulus.y;
    ((__position._M_current)->stimulus).intensity = stimulus.intensity;
    *(undefined4 *)&((__position._M_current)->stimulus).field_0xc = stimulus._12_4_;
    ppEVar1 = &(engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return;
}

Assistant:

void encodeEngramIfUnique(Stimulus stimulus, std::vector<Engram>& engrams)
	{		
		if (stimulus.type == StimulusType::Auditory)
		{
			bool heardBefore = false;

			for(auto& engram : engrams)
			{
				if (engram.type == EngramType::Heard)
				{					
					if (engram.stimulus.auditory.tag == stimulus.auditory.tag
						&& (engram.stimulus.x == stimulus.x
							&& engram.stimulus.y == stimulus.y))
					{
						heardBefore = true;						
					}					
				}
			}

			if (!heardBefore)
			{
				Engram engram;
				engram.type = EngramType::Heard;
				engram.age = 0;
				engram.stimulus = stimulus;

				engrams.push_back(engram);
			}
		}
		else 
		{
			bool seenBefore = false;

			for(auto& engram : engrams)
			{
				if (engram.type == EngramType::Saw)
				{
					if (engram.stimulus.visual.tag == stimulus.visual.tag
						&& (engram.stimulus.x == stimulus.x
							&& engram.stimulus.y == stimulus.y)
						&& engram.stimulus.visual.target == stimulus.visual.target)
					{
						seenBefore = true;
					}
				}
			}

			if (!seenBefore)
			{
				Engram engram;
				engram.type = EngramType::Saw;
				engram.age = 0;
				engram.stimulus = stimulus;

				engrams.push_back(engram);
			}
		}		
	}